

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O0

Config * __thiscall QPDFJob::Config::showAttachment(Config *this,string *parameter)

{
  element_type *peVar1;
  string *parameter_local;
  Config *this_local;
  
  peVar1 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this->o);
  std::__cxx11::string::operator=((string *)&peVar1->attachment_to_show,(string *)parameter);
  peVar1 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this->o);
  peVar1->require_outfile = false;
  return this;
}

Assistant:

QPDFJob::Config*
QPDFJob::Config::showAttachment(std::string const& parameter)
{
    o.m->attachment_to_show = parameter;
    o.m->require_outfile = false;
    return this;
}